

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O0

bool cvui::mouse(String *theWindowName,int theQuery)

{
  bool bVar1;
  cvui_context_t *pcVar2;
  bool aRet;
  cvui_mouse_btn_t *aButton;
  int theQuery_local;
  String *theWindowName_local;
  
  pcVar2 = internal::getContext(theWindowName);
  bVar1 = internal::isMouseButton(&(pcVar2->mouse).anyButton,theQuery);
  return bVar1;
}

Assistant:

bool mouse(const cv::String& theWindowName, int theQuery) {
	cvui_mouse_btn_t& aButton = internal::getContext(theWindowName).mouse.anyButton;
	bool aRet = internal::isMouseButton(aButton, theQuery);

	return aRet;
}